

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O1

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::resize
          (PlainObjectBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_> *this,Index nbRows,
          Index nbCols)

{
  uint *puVar1;
  undefined8 *puVar2;
  
  if ((nbRows < 0) || (nbCols != 3)) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dilevin[P]computer-graphics-shader-pipeline/eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<unsigned int, -1, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<unsigned int, -1, 3, 1>]"
                 );
  }
  if (0x2aaaaaaaaaaaaaaa < nbRows) goto LAB_00131118;
  if ((this->m_storage).m_rows != nbRows) {
    free((this->m_storage).m_data);
    if (nbRows == 0) {
      puVar1 = (uint *)0x0;
    }
    else {
      if (0x1555555555555555 < (ulong)nbRows) {
LAB_00131118:
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = XDestroyIC;
        __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      puVar1 = (uint *)malloc(nbRows * 0xc);
      if (puVar1 == (uint *)0x0) goto LAB_00131118;
    }
    (this->m_storage).m_data = puVar1;
  }
  (this->m_storage).m_rows = nbRows;
  return;
}

Assistant:

EIGEN_STRONG_INLINE void resize(Index nbRows, Index nbCols)
    {
      eigen_assert(   EIGEN_IMPLIES(RowsAtCompileTime!=Dynamic,nbRows==RowsAtCompileTime)
                   && EIGEN_IMPLIES(ColsAtCompileTime!=Dynamic,nbCols==ColsAtCompileTime)
                   && EIGEN_IMPLIES(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic,nbRows<=MaxRowsAtCompileTime)
                   && EIGEN_IMPLIES(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic,nbCols<=MaxColsAtCompileTime)
                   && nbRows>=0 && nbCols>=0 && "Invalid sizes when resizing a matrix or array.");
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(nbRows, nbCols);
      #ifdef EIGEN_INITIALIZE_COEFFS
        Index size = nbRows*nbCols;
        bool size_changed = size != this->size();
        m_storage.resize(size, nbRows, nbCols);
        if(size_changed) EIGEN_INITIALIZE_COEFFS_IF_THAT_OPTION_IS_ENABLED
      #else
        internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(nbRows, nbCols);
        m_storage.resize(nbRows*nbCols, nbRows, nbCols);
      #endif
    }